

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int updatewindow(z_streamp strm,Bytef *end,uint copy)

{
  internal_state *piVar1;
  void *__dest;
  uint uVar2;
  uint uVar3;
  
  piVar1 = strm->state;
  __dest = *(void **)(piVar1 + 0x48);
  if (__dest == (void *)0x0) {
    __dest = (*strm->zalloc)(strm->opaque,1 << ((byte)piVar1[0x38] & 0x1f),1);
    *(void **)(piVar1 + 0x48) = __dest;
    if (__dest == (voidpf)0x0) {
      return 1;
    }
  }
  uVar2 = *(uint *)(piVar1 + 0x3c);
  if (uVar2 == 0) {
    uVar2 = 1 << ((byte)piVar1[0x38] & 0x1f);
    *(uint *)(piVar1 + 0x3c) = uVar2;
    *(undefined8 *)(piVar1 + 0x40) = 0;
  }
  if (copy < uVar2) {
    uVar2 = uVar2 - *(uint *)(piVar1 + 0x44);
    uVar3 = copy;
    if (uVar2 < copy) {
      uVar3 = uVar2;
    }
    memcpy((void *)((long)__dest + (ulong)*(uint *)(piVar1 + 0x44)),end + -(ulong)copy,(ulong)uVar3)
    ;
    if (copy <= uVar2) {
      uVar2 = *(int *)(piVar1 + 0x44) + uVar3;
      if (*(int *)(piVar1 + 0x44) + uVar3 == *(uint *)(piVar1 + 0x3c)) {
        uVar2 = 0;
      }
      *(uint *)(piVar1 + 0x44) = uVar2;
      if (*(uint *)(piVar1 + 0x3c) <= *(uint *)(piVar1 + 0x40)) {
        return 0;
      }
      *(uint *)(piVar1 + 0x40) = *(uint *)(piVar1 + 0x40) + uVar3;
      return 0;
    }
    uVar3 = copy - uVar3;
    memcpy(*(void **)(piVar1 + 0x48),end + -(ulong)uVar3,(ulong)uVar3);
    *(uint *)(piVar1 + 0x44) = uVar3;
  }
  else {
    memcpy(__dest,end + -(ulong)uVar2,(ulong)uVar2);
    *(undefined4 *)(piVar1 + 0x44) = 0;
  }
  *(undefined4 *)(piVar1 + 0x40) = *(undefined4 *)(piVar1 + 0x3c);
  return 0;
}

Assistant:

local int updatewindow(z_streamp strm, const Bytef *end, unsigned copy) {
    struct inflate_state FAR *state;
    unsigned dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->wnext = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    if (copy >= state->wsize) {
        zmemcpy(state->window, end - state->wsize, state->wsize);
        state->wnext = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->wnext;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->wnext, end - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, end - copy, copy);
            state->wnext = copy;
            state->whave = state->wsize;
        }
        else {
            state->wnext += dist;
            if (state->wnext == state->wsize) state->wnext = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}